

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

void anon_unknown.dwarf_837e8::syntax(void)

{
  puts("Snestistics Syntax:");
  puts("  snestistics --option1 value --option2 value");
  putchar(10);
  puts("Options:");
  putchar(10);
  puts(" -romfile (--r) <filename>                      ROM file.");
  puts("                                                Currently only LoROM ROMs are supported.");
  puts(" -romsize (--rs) <number>                       Size of ROM cartridge (without header).");
  puts("                                                0 means auto-detect.");
  puts("                                                Default: 0.");
  puts(" -tracefile (--t) <filename>                    Trace file from an emulation session.");
  puts(
      "                                                Multiple allowed for assembly source listing."
      );
  puts(" -nmifirst (--n0) <number>                      First NMI to consider for trace log.");
  puts("                                                Default: 0.");
  puts(" -nmilast (--n1) <number>                       Last NMI to consider for trace log.");
  puts("                                                Default: 0.");
  puts(" -tracelogoutfile (--tl) <filename>             Generate trace log.");
  puts(
      "                                                Nmi range can be controlled using -nmifirst and -nmilast."
      );
  puts(
      "                                                Custom printing can be done using scripting."
      );
  puts(" -scriptfile (--s) <filename>                   A squirrel script.");
  puts("                                                See user guide for scripting reference.");
  puts(" -labelsfile (--l) <filename>                   A file containing annotations.");
  puts("                                                Custom file format.");
  puts(" -autolabelsfile (--al) <filename>              A file containing annotations.");
  puts(
      "                                                It will be regenerated if missing or if -autoannotate is specified."
      );
  puts(
      " -autoannotate (--aa) <true|false>              A file where automatically generated annotations are stored."
      );
  puts(
      " -symbolfmaoutfile (--sf) <filename>            Generate symbols file in FMA format compatible with bsnes-plus."
      );
  puts(
      " -symbolmesensoutfile (--sm) <filename>          Generate symbols file in Mesen format compatible with Mesen emulator."
      );
  puts(" -rewindoutfile (--rw) <filename>               Generate rewind report in dot file format.")
  ;
  puts("                                                Use graphviz to generate PDF/PNG report.");
  puts(" -reportoutfile (--rp) <filename>               Generate assembly report.");
  puts("                                                Companion file to -asmoutfile.");
  puts(" -asmoutfile (--a) <filename>                   Generate assembly listing.");
  puts(
      " -asmheaderfile (--ah) <filename>               File content will be included in assembly listing."
      );
  puts(
      " -asmprintpc (--apc) <true|false>               Print program counter in assembly source listing."
      );
  puts(
      " -asmprintbytes (--ab) <true|false>             Print opcode bytes in assembly source listing."
      );
  puts(
      " -asmprintregistersizes (--ars) <true|false>    Print registers sizes in assembly source listing."
      );
  puts(" -asmprintdb (--adb) <true|false>               Print data bank in assembly source listing."
      );
  puts(
      " -asmprintdp (--adp) <true|false>               Print direct page in assembly source listing."
      );
  puts(
      " -asmlowercaseop <true|false>                   Print lower-case opcode in assembly source listing."
      );
  puts(
      " -asmcorrectwla <true|false>                    Make sure generated source compiled in WLA DX."
      );
  puts(
      " -predict (--p) <never|*functions*|everywhere>  This setting specify where snestistics is allowed to predict code."
      );
  puts(
      "                                                This is currently only used for assembly listing."
      );
  return;
}

Assistant:

void syntax() {
		printf("Snestistics Syntax:\n");
		printf("  snestistics --option1 value --option2 value\n");
		printf("\n");
		printf("Options:\n");
		printf("\n");
		printf(" -romfile (--r) <filename>                      ROM file.\n");
		printf("                                                Currently only LoROM ROMs are supported.\n");
		printf(" -romsize (--rs) <number>                       Size of ROM cartridge (without header).\n");
		printf("                                                0 means auto-detect.\n");
		printf("                                                Default: 0.\n");
		printf(" -tracefile (--t) <filename>                    Trace file from an emulation session.\n");
		printf("                                                Multiple allowed for assembly source listing.\n");
		printf(" -nmifirst (--n0) <number>                      First NMI to consider for trace log.\n");
		printf("                                                Default: 0.\n");
		printf(" -nmilast (--n1) <number>                       Last NMI to consider for trace log.\n");
		printf("                                                Default: 0.\n");
		printf(" -tracelogoutfile (--tl) <filename>             Generate trace log.\n");
		printf("                                                Nmi range can be controlled using -nmifirst and -nmilast.\n");
		printf("                                                Custom printing can be done using scripting.\n");
		printf(" -scriptfile (--s) <filename>                   A squirrel script.\n");
		printf("                                                See user guide for scripting reference.\n");
		printf(" -labelsfile (--l) <filename>                   A file containing annotations.\n");
		printf("                                                Custom file format.\n");
		printf(" -autolabelsfile (--al) <filename>              A file containing annotations.\n");
		printf("                                                It will be regenerated if missing or if -autoannotate is specified.\n");
		printf(" -autoannotate (--aa) <true|false>              A file where automatically generated annotations are stored.\n");
		printf(" -symbolfmaoutfile (--sf) <filename>            Generate symbols file in FMA format compatible with bsnes-plus.\n");
		printf(" -symbolmesensoutfile (--sm) <filename>          Generate symbols file in Mesen format compatible with Mesen emulator.\n");
		printf(" -rewindoutfile (--rw) <filename>               Generate rewind report in dot file format.\n");
		printf("                                                Use graphviz to generate PDF/PNG report.\n");
		printf(" -reportoutfile (--rp) <filename>               Generate assembly report.\n");
		printf("                                                Companion file to -asmoutfile.\n");
		printf(" -asmoutfile (--a) <filename>                   Generate assembly listing.\n");
		printf(" -asmheaderfile (--ah) <filename>               File content will be included in assembly listing.\n");
		printf(" -asmprintpc (--apc) <true|false>               Print program counter in assembly source listing.\n");
		printf(" -asmprintbytes (--ab) <true|false>             Print opcode bytes in assembly source listing.\n");
		printf(" -asmprintregistersizes (--ars) <true|false>    Print registers sizes in assembly source listing.\n");
		printf(" -asmprintdb (--adb) <true|false>               Print data bank in assembly source listing.\n");
		printf(" -asmprintdp (--adp) <true|false>               Print direct page in assembly source listing.\n");
		printf(" -asmlowercaseop <true|false>                   Print lower-case opcode in assembly source listing.\n");
		printf(" -asmcorrectwla <true|false>                    Make sure generated source compiled in WLA DX.\n");
		printf(" -predict (--p) <never|*functions*|everywhere>  This setting specify where snestistics is allowed to predict code.\n");
		printf("                                                This is currently only used for assembly listing.\n");
	}